

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,BasicCStringRef<char> format_str)

{
  char cVar1;
  bool bVar2;
  Char **ppCVar3;
  FormatError *this_00;
  Char **s_00;
  CStringRef in_RDI;
  Arg arg;
  Char c;
  Char *start;
  Char *s;
  Arg *in_stack_00000188;
  Char **in_stack_00000190;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *in_stack_00000198;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  BasicWriter<char> *in_stack_ffffffffffffffb8;
  FormatterBase *in_stack_ffffffffffffffc0;
  Char **in_stack_ffffffffffffffc8;
  BasicCStringRef<char> in_stack_ffffffffffffffd0;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *this_01;
  BasicCStringRef<char> local_8;
  
  this_01 = (BasicFormatter<char,_fmt::ArgFormatter<char>_> *)in_RDI.data_;
  ppCVar3 = (Char **)BasicCStringRef<char>::c_str(&local_8);
  while( true ) {
    while( true ) {
      do {
        if (*(char *)ppCVar3 == '\0') {
          internal::FormatterBase::write<char>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     in_stack_ffffffffffffffa8);
          return;
        }
        s_00 = (Char **)((long)ppCVar3 + 1);
        cVar1 = *(char *)ppCVar3;
      } while ((cVar1 != '{') && (ppCVar3 = s_00, cVar1 != '}'));
      if (*(char *)s_00 != cVar1) break;
      internal::FormatterBase::write<char>
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffa8);
      ppCVar3 = (Char **)((long)s_00 + 1);
    }
    if (cVar1 == '}') break;
    internal::FormatterBase::write<char>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8);
    bVar2 = internal::is_name_start<char>(*(char *)s_00);
    if (bVar2) {
      parse_arg_name(this_01,s_00);
    }
    else {
      parse_arg_index((BasicFormatter<char,_fmt::ArgFormatter<char>_> *)
                      in_stack_ffffffffffffffd0.data_,in_stack_ffffffffffffffc8);
    }
    ppCVar3 = (Char **)format(in_stack_00000198,in_stack_00000190,in_stack_00000188);
  }
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffffd0,"unmatched \'}\' in format string");
  FormatError::FormatError(this_00,in_RDI);
  __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void BasicFormatter<Char, AF>::format(BasicCStringRef<Char> format_str) {
  const Char *s = format_str.c_str();
  const Char *start = s;
  while (*s) {
    Char c = *s++;
    if (c != '{' && c != '}') continue;
    if (*s == c) {
      write(writer_, start, s);
      start = ++s;
      continue;
    }
    if (c == '}')
      FMT_THROW(FormatError("unmatched '}' in format string"));
    write(writer_, start, s - 1);
    internal::Arg arg = internal::is_name_start(*s) ?
          parse_arg_name(s) : parse_arg_index(s);
    start = s = format(s, arg);
  }
  write(writer_, start, s);
}